

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O0

void __thiscall
Firework::Firework(Firework *this,char ball,char stream,char tail,char explosionParticle)

{
  char explosionParticle_local;
  char tail_local;
  char stream_local;
  char ball_local;
  Firework *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->stream);
  std::__cxx11::string::string((string *)&this->tail);
  std::__cxx11::string::string((string *)&this->explosionParticle);
  this->fireworkStage = 0;
  std::__cxx11::string::operator=((string *)this,ball);
  std::__cxx11::string::operator=((string *)&this->stream,stream);
  std::__cxx11::string::operator=((string *)&this->tail,tail);
  std::__cxx11::string::operator=((string *)&this->explosionParticle,explosionParticle);
  this->streamFrameCounter = 1;
  this->explosionFrameCounter = 0.0;
  return;
}

Assistant:

Firework::Firework(char ball, char stream, char tail, char explosionParticle) {
    fireworkStage = UNITIALIZED;

    this->ball = ball;
    this->stream = stream;
    this->tail = tail;
    this->explosionParticle = explosionParticle;

    streamFrameCounter = 1;
    explosionFrameCounter = 0;
}